

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  uint uVar6;
  double *pdVar7;
  long lVar8;
  SPxException *this_00;
  SPxInternalCodeException *pSVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double eps;
  double extraout_XMM0_Qa_03;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  allocator local_a9;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double dStack_80;
  string local_78;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  iVar5 = this->m_j;
  iVar1 = this->m_old_j;
  if (iVar5 != iVar1) {
    pdVar2 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[iVar1] = pdVar2[iVar5];
    pdVar2 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[iVar1] = pdVar2[iVar5];
    cStatus->data[iVar1] = cStatus->data[iVar5];
  }
  local_98 = SVectorBase<double>::operator[](&(this->m_row).super_SVectorBase<double>,iVar5);
  iVar5 = this->m_i;
  pdVar2 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a8 = pdVar2[iVar5];
  if (ABS(local_a8) <= 1e-06) {
    pdVar2[iVar5] = 0.0;
    dVar10 = 0.0;
  }
  else {
    dStack_a0 = 0.0;
    pdVar7 = (double *)infinity();
    if (*pdVar7 <= local_a8) {
      this_00 = (SPxException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_78,"Simplifier: infinite activities - aborting unsimplification",
                 &local_a9);
      SPxException::SPxException(this_00,&local_78);
      __cxa_throw(this_00,&SPxException::typeinfo,SPxException::~SPxException);
    }
    iVar5 = this->m_i;
    dVar10 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar5];
  }
  auVar11._0_8_ = ABS(this->m_lhs);
  auVar11._8_8_ = ABS(this->m_rhs);
  auVar14._0_8_ = ABS(dVar10);
  auVar14._8_8_ = ABS(dVar10);
  auVar11 = maxpd(auVar11,auVar14);
  dVar13 = auVar11._8_8_;
  auVar15._8_8_ = -(ulong)(dVar13 < 1.0);
  auVar15._0_8_ = -(ulong)(auVar11._0_8_ < 1.0);
  uVar6 = movmskpd(iVar5,auVar15);
  local_88 = 1.0;
  dStack_80 = 0.0;
  if ((uVar6 & 1) == 0) {
    local_88 = auVar11._0_8_;
    dStack_80 = dVar13;
  }
  local_58 = 1.0;
  dStack_50 = 0.0;
  if ((uVar6 & 2) == 0) {
    local_58 = dVar13;
    dStack_50 = dVar13;
  }
  auVar17._8_8_ = dVar10;
  auVar17._0_8_ = this->m_lhs;
  auVar12._8_8_ = local_88;
  auVar12._0_8_ = local_88;
  auVar11 = divpd(auVar17,auVar12);
  dStack_a0 = auVar11._8_8_;
  local_a8 = auVar11._0_8_ - dStack_a0;
  auVar16._8_8_ = dVar10;
  auVar16._0_8_ = this->m_rhs;
  auVar3._8_8_ = local_58;
  auVar3._0_8_ = local_58;
  auVar11 = divpd(auVar16,auVar3);
  dStack_40 = auVar11._8_8_;
  local_48 = auVar11._0_8_ - dStack_40;
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  local_a8 = (double)(~-(ulong)(ABS(local_a8) <= extraout_XMM0_Qa) & (ulong)local_a8);
  dStack_a0 = (double)(~(ulong)ABS(dStack_a0) & (ulong)dStack_a0);
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  dStack_40 = (double)(~(ulong)ABS(dStack_40) & (ulong)dStack_40);
  local_a8 = local_a8 * local_88;
  local_48 = (double)(~-(ulong)(ABS(local_48) <= extraout_XMM0_Qa_00) & (ulong)local_48) * local_58;
  local_58 = local_48;
  dStack_50 = dStack_40;
  if (0.0 < local_98) {
    local_58 = local_a8;
    dStack_50 = dStack_a0;
  }
  (*(this->super_PostStep)._vptr_PostStep[6])(this);
  local_88 = extraout_XMM0_Qa_01;
  (*(this->super_PostStep)._vptr_PostStep[6])(this);
  switch(rStatus->data[this->m_i]) {
  case ON_UPPER:
    local_a8 = this->m_lower;
    pdVar7 = (double *)infinity();
    if (local_a8 <= -*pdVar7) {
      local_a8 = this->m_upper;
      pdVar7 = (double *)infinity();
      if (*pdVar7 <= local_a8) {
LAB_001bfc63:
        lVar8 = (long)this->m_j;
        (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar8] = 0.0;
        cStatus->data[lVar8] = ZERO;
        dVar10 = 0.0;
        goto LAB_001bfd61;
      }
    }
    dVar13 = this->m_lower;
    dVar10 = this->m_upper;
    if ((dVar13 == dVar10) && (!NAN(dVar13) && !NAN(dVar10))) {
LAB_001bfb45:
      dVar10 = dVar13;
      lVar8 = (long)this->m_j;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = dVar10;
      cStatus->data[lVar8] = FIXED;
      goto LAB_001bfd61;
    }
    if (0.0 < local_98) {
LAB_001bfd2c:
      dVar10 = dVar13;
      lVar8 = (long)this->m_j;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = dVar10;
      cStatus->data[lVar8] = ON_LOWER;
      goto LAB_001bfd61;
    }
    if (0.0 <= local_98) {
      pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_78,"XMAISM02 This should never happen.",&local_a9);
      SPxInternalCodeException::SPxInternalCodeException(pSVar9,&local_78);
      __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    break;
  case ON_LOWER:
    local_a8 = this->m_lower;
    pdVar7 = (double *)infinity();
    if (local_a8 <= -*pdVar7) {
      local_a8 = this->m_upper;
      pdVar7 = (double *)infinity();
      if (*pdVar7 <= local_a8) goto LAB_001bfc63;
    }
    dVar13 = this->m_lower;
    dVar10 = this->m_upper;
    if ((dVar13 == dVar10) && (!NAN(dVar13) && !NAN(dVar10))) goto LAB_001bfb45;
    if (local_98 <= 0.0) {
      if (0.0 <= local_98) {
        pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_78,"XMAISM01 This should never happen.",&local_a9);
        SPxInternalCodeException::SPxInternalCodeException(pSVar9,&local_78);
        __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      goto LAB_001bfd2c;
    }
    break;
  case FIXED:
    local_a8 = this->m_lower;
    pdVar7 = (double *)infinity();
    if (local_a8 <= -*pdVar7) {
      local_a8 = this->m_upper;
      pdVar7 = (double *)infinity();
      if (*pdVar7 <= local_a8) goto LAB_001bfc63;
    }
    dVar10 = (this->m_lower + this->m_upper) * 0.5;
    lVar8 = (long)this->m_j;
    (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar8] = dVar10;
    cStatus->data[lVar8] = FIXED;
    goto LAB_001bfd61;
  default:
    pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_78,"XMAISM04 This should never happen.",&local_a9)
    ;
    SPxInternalCodeException::SPxInternalCodeException(pSVar9,&local_78);
    __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case BASIC:
    local_58 = (double)(~-(ulong)(ABS(local_58 / local_98) <= local_88) &
                       (ulong)(local_58 / local_98));
    dStack_50 = (double)(~((ulong)dStack_50 & 0x7fffffffffffffff) & (ulong)dStack_50);
    local_88 = this->m_lower;
    local_38 = extraout_XMM0_Qa_02;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    bVar4 = GErel<double,double,double>(local_88,local_58,eps);
    if (bVar4) {
      local_88 = this->m_lower;
      pdVar7 = (double *)infinity();
      if (-*pdVar7 < local_88) {
        dVar10 = this->m_lower;
        lVar8 = (long)this->m_j;
        (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar8] = dVar10;
        cStatus->data[lVar8] = (this->m_upper == dVar10) + ON_LOWER;
        goto LAB_001bfd61;
      }
    }
    local_a8 = (double)(~-(ulong)(local_98 <= 0.0) & (ulong)local_48 |
                       (ulong)local_a8 & -(ulong)(local_98 <= 0.0)) / local_98;
    local_88 = ABS(local_a8);
    dStack_80 = (double)((ulong)dStack_40 & 0x7fffffffffffffff);
    local_a8 = (double)(~-(ulong)(local_88 <= local_38) & (ulong)local_a8);
    dStack_a0 = (double)(~(ulong)dStack_80 & (ulong)dStack_40);
    local_48 = this->m_upper;
    dStack_40 = 0.0;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    dVar13 = (double)(~-(ulong)(local_88 <= local_38) & (ulong)local_88);
    dVar10 = ABS(local_48);
    if (ABS(local_48) <= dVar13) {
      dVar10 = dVar13;
    }
    if (dVar10 <= 1.0) {
      dVar10 = 1.0;
    }
    if ((local_48 - local_a8) / dVar10 <= extraout_XMM0_Qa_03) {
      local_88 = this->m_upper;
      pdVar7 = (double *)infinity();
      if (local_88 < *pdVar7) {
        dVar10 = this->m_upper;
        lVar8 = (long)this->m_j;
        (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar8] = dVar10;
        cStatus->data[lVar8] = (-(uint)(this->m_lower == dVar10) & 1) * 2;
        goto LAB_001bfd61;
      }
    }
    pdVar7 = (double *)infinity();
    if (local_58 <= -*pdVar7) {
      pdVar7 = (double *)infinity();
      if (*pdVar7 <= local_a8) {
        pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_78,"XMAISM03 This should never happen.",&local_a9);
        SPxInternalCodeException::SPxInternalCodeException(pSVar9,&local_78);
        __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      bVar4 = local_98 <= 0.0;
      local_58 = local_a8;
    }
    else {
      bVar4 = 0.0 < local_98;
    }
    lVar8 = (long)this->m_j;
    (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar8] = local_58;
    cStatus->data[lVar8] = BASIC;
    rStatus->data[this->m_i] = (uint)bVar4;
    dVar10 = local_58;
    goto LAB_001bfd61;
  }
  lVar8 = (long)this->m_j;
  (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar8] = dVar10;
  cStatus->data[lVar8] = ON_UPPER;
LAB_001bfd61:
  iVar5 = this->m_i;
  pdVar2 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[iVar5] = dVar10 * local_98 + pdVar2[iVar5];
  (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar8] =
       -local_98 *
       (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar5];
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}